

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O2

_Bool iterator_descend(Iterator *self,uint32_t goal_position)

{
  anon_struct_16_3_8b926706_for_stack *self_00;
  undefined4 uVar1;
  TreeCursorEntry *pTVar2;
  SubtreeHeapData *pSVar3;
  undefined4 uVar5;
  Subtree *pSVar4;
  Subtree self_01;
  _Bool _Var6;
  uint uVar7;
  uint32_t uVar8;
  long lVar9;
  uint32_t uVar10;
  ulong uVar11;
  undefined8 uVar12;
  uint32_t uVar13;
  Length LVar14;
  Length LVar15;
  
  if (self->in_padding == false) {
    self_00 = &(self->cursor).stack;
    do {
      uVar8 = (self->cursor).stack.size;
      if (uVar8 == 0) {
        __assert_fail("(uint32_t)(&self->cursor.stack)->size - 1 < (&self->cursor.stack)->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/get_changed_ranges.c"
                      ,0xca,"_Bool iterator_descend(Iterator *, uint32_t)");
      }
      uVar7 = uVar8 - 1;
      pTVar2 = self_00->contents;
      pSVar3 = (pTVar2[uVar7].subtree)->ptr;
      if (((ulong)pSVar3 & 1) == 0) {
        uVar11 = (ulong)pSVar3->child_count;
      }
      else {
        uVar11 = 0;
      }
      uVar1 = pTVar2[uVar7].position.bytes;
      uVar5 = pTVar2[uVar7].position.extent.row;
      LVar15.extent.row = uVar5;
      LVar15.bytes = uVar1;
      LVar15.extent.column = pTVar2[uVar7].position.extent.column;
      uVar10 = 0;
      lVar9 = 0;
      uVar8 = 0;
      while( true ) {
        uVar13 = LVar15.extent.column;
        uVar12 = LVar15._0_8_;
        if (uVar11 << 3 == lVar9) goto LAB_00111822;
        pSVar4 = (pSVar3->field_17).field_0.children;
        self_01 = *(Subtree *)((long)pSVar4 + lVar9);
        LVar14 = ts_subtree_padding(self_01);
        LVar14 = length_add(LVar15,LVar14);
        LVar15 = ts_subtree_size(self_01);
        LVar15 = length_add(LVar14,LVar15);
        if (goal_position < LVar15.bytes) break;
        _Var6 = ts_subtree_extra(self_01);
        uVar8 = uVar8 + !_Var6;
        lVar9 = lVar9 + 8;
        uVar10 = uVar10 + 1;
      }
      array__grow((VoidArray *)self_00,0x20);
      pTVar2 = (self->cursor).stack.contents;
      uVar7 = (self->cursor).stack.size;
      (self->cursor).stack.size = uVar7 + 1;
      pTVar2[uVar7].subtree = (Subtree *)((long)pSVar4 + lVar9);
      pTVar2[uVar7].position.bytes = (int)uVar12;
      pTVar2[uVar7].position.extent.row = (int)((ulong)uVar12 >> 0x20);
      pTVar2[uVar7].position.extent.column = uVar13;
      pTVar2[uVar7].child_index = uVar10;
      pTVar2[uVar7].structural_child_index = uVar8;
      _Var6 = iterator_tree_is_visible(self);
    } while (!_Var6);
    if (goal_position < LVar14.bytes) {
      self->in_padding = true;
    }
    else {
      self->visible_depth = self->visible_depth + 1;
    }
    _Var6 = true;
  }
  else {
LAB_00111822:
    _Var6 = false;
  }
  return _Var6;
}

Assistant:

static bool iterator_descend(Iterator *self, uint32_t goal_position) {
  if (self->in_padding) return false;

  bool did_descend;
  do {
    did_descend = false;
    TreeCursorEntry entry = *array_back(&self->cursor.stack);
    Length position = entry.position;
    uint32_t structural_child_index = 0;
    for (uint32_t i = 0, n = ts_subtree_child_count(*entry.subtree); i < n; i++) {
      const Subtree *child = &entry.subtree->ptr->children[i];
      Length child_left = length_add(position, ts_subtree_padding(*child));
      Length child_right = length_add(child_left, ts_subtree_size(*child));

      if (child_right.bytes > goal_position) {
        array_push(&self->cursor.stack, ((TreeCursorEntry){
          .subtree = child,
          .position = position,
          .child_index = i,
          .structural_child_index = structural_child_index,
        }));

        if (iterator_tree_is_visible(self)) {
          if (child_left.bytes > goal_position) {
            self->in_padding = true;
          } else {
            self->visible_depth++;
          }
          return true;
        }

        did_descend = true;
        break;
      }

      position = child_right;
      if (!ts_subtree_extra(*child)) structural_child_index++;
    }
  } while (did_descend);

  return false;
}